

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

string * __thiscall
pbrt::FloatCheckerboardTexture::ToString_abi_cxx11_
          (string *__return_storage_ptr__,FloatCheckerboardTexture *this)

{
  ulong uVar1;
  ulong uVar2;
  char *local_88;
  string local_80;
  string local_60;
  char *local_40;
  char *local_38;
  
  uVar1 = (this->map2D).
          super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
          .bits;
  local_88 = "(nullptr)";
  if ((uVar1 & 0xffffffffffff) != 0) {
    TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
    ::ToString_abi_cxx11_
              (&local_60,
               (TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                *)this);
    local_88 = local_60._M_dataplus._M_p;
  }
  uVar2 = (this->map3D).super_TaggedPointer<pbrt::TransformMapping3D>.bits;
  local_38 = "(nullptr)";
  if ((uVar2 & 0xffffffffffff) != 0) {
    TaggedPointer<pbrt::TransformMapping3D>::ToString_abi_cxx11_
              (&local_80,&(this->map3D).super_TaggedPointer<pbrt::TransformMapping3D>);
    local_38 = local_80._M_dataplus._M_p;
  }
  local_40 = "closed-form";
  if (this->aaMethod == None) {
    local_40 = "none";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<char_const*,char_const*,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,char_const*>
            (__return_storage_ptr__,
             "[ FloatCheckerboardTexture map2D: %s map3D: %s tex[0]: %s tex[1]: %s aaMethod: %s]",
             &local_88,&local_38,this->tex,this->tex + 1,&local_40);
  if (((uVar2 & 0xffffffffffff) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2)) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (((uVar1 & 0xffffffffffff) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2)) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FloatCheckerboardTexture::ToString() const {
    return StringPrintf("[ FloatCheckerboardTexture map2D: %s map3D: %s "
                        "tex[0]: %s tex[1]: %s aaMethod: %s]",
                        map2D ? map2D.ToString().c_str() : "(nullptr)",
                        map3D ? map3D.ToString().c_str() : "(nullptr)", tex[0], tex[1],
                        aaMethod == AAMethod::None ? "none" : "closed-form");
}